

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

mp_int * ecdsa_signing_exponent_from_data(ec_curve *curve,ecsign_extra *extra,ptrlen data)

{
  ssh_hash *psVar1;
  mp_int *x;
  size_t sVar2;
  size_t sVar3;
  mp_int *pmVar4;
  size_t bits;
  ptrlen bytes;
  uchar hash [114];
  uchar auStack_a8 [128];
  
  psVar1 = (*extra->hash->new)(extra->hash);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_datapl(psVar1->binarysink_,data);
  (*psVar1->vt->digest)(psVar1,auStack_a8);
  (*psVar1->vt->free)(psVar1);
  bytes.len = extra->hash->hlen;
  bytes.ptr = auStack_a8;
  x = mp_from_bytes_be(bytes);
  sVar2 = mp_get_nbits(x);
  sVar3 = mp_get_nbits((curve->field_6).w.G_order);
  bits = 0;
  if (0 < (long)(sVar2 - sVar3)) {
    bits = sVar2 - sVar3;
  }
  pmVar4 = mp_rshift_safe(x,bits);
  mp_free(x);
  return pmVar4;
}

Assistant:

static mp_int *ecdsa_signing_exponent_from_data(
    const struct ec_curve *curve, const struct ecsign_extra *extra,
    ptrlen data)
{
    /* Hash the data being signed. */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    put_datapl(h, data);
    ssh_hash_final(h, hash);

    /*
     * Take the leftmost b bits of the hash of the signed data (where
     * b is the number of bits in order(G)), interpreted big-endian.
     */
    mp_int *z = mp_from_bytes_be(make_ptrlen(hash, extra->hash->hlen));
    size_t zbits = mp_get_nbits(z);
    size_t nbits = mp_get_nbits(curve->w.G_order);
    size_t shift = zbits - nbits;
    /* Bound the shift count below at 0, using bit twiddling to avoid
     * a conditional branch */
    shift &= ~-(shift >> (CHAR_BIT * sizeof(size_t) - 1));
    mp_int *toret = mp_rshift_safe(z, shift);
    mp_free(z);

    return toret;
}